

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O1

int decompress_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  JDIMENSION JVar1;
  jpeg_d_coef_controller *pjVar2;
  inverse_DCT_method_ptr p_Var3;
  int iVar4;
  uint uVar5;
  JBLOCKARRAY ppaJVar6;
  uint uVar7;
  JBLOCKROW paJVar8;
  JSAMPARRAY ppJVar9;
  jpeg_component_info *pjVar10;
  JDIMENSION JVar11;
  long local_78;
  ulong local_68;
  
  pjVar2 = cinfo->coef;
  JVar1 = cinfo->total_iMCU_rows;
  while ((cinfo->input_scan_number < cinfo->output_scan_number ||
         ((cinfo->input_scan_number == cinfo->output_scan_number &&
          (cinfo->input_iMCU_row <= cinfo->output_iMCU_row))))) {
    iVar4 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar4 == 0) {
      return 0;
    }
  }
  if (0 < cinfo->num_components) {
    pjVar10 = cinfo->comp_info;
    local_78 = 0;
    do {
      if (pjVar10->component_needed != 0) {
        ppaJVar6 = (*cinfo->mem->access_virt_barray)
                             ((j_common_ptr)cinfo,
                              (jvirt_barray_ptr)(&pjVar2[3].start_output_pass)[local_78],
                              cinfo->output_iMCU_row * pjVar10->v_samp_factor,pjVar10->v_samp_factor
                              ,0);
        if (cinfo->output_iMCU_row < JVar1 - 1) {
          uVar5 = pjVar10->v_samp_factor;
        }
        else {
          uVar5 = pjVar10->height_in_blocks % (uint)pjVar10->v_samp_factor;
          if (uVar5 == 0) {
            uVar5 = pjVar10->v_samp_factor;
          }
        }
        if (0 < (int)uVar5) {
          p_Var3 = cinfo->idct->inverse_DCT[local_78];
          ppJVar9 = output_buf[local_78];
          local_68 = 0;
          do {
            if (pjVar10->width_in_blocks != 0) {
              paJVar8 = ppaJVar6[local_68];
              JVar11 = 0;
              uVar7 = 0;
              do {
                (*p_Var3)(cinfo,pjVar10,*paJVar8,ppJVar9,JVar11);
                JVar11 = JVar11 + pjVar10->DCT_h_scaled_size;
                paJVar8 = paJVar8 + 1;
                uVar7 = uVar7 + 1;
              } while (uVar7 < pjVar10->width_in_blocks);
            }
            ppJVar9 = ppJVar9 + pjVar10->DCT_v_scaled_size;
            local_68 = local_68 + 1;
          } while (local_68 != uVar5);
        }
      }
      local_78 = local_78 + 1;
      pjVar10 = pjVar10 + 1;
    } while (local_78 < cinfo->num_components);
  }
  uVar5 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar5;
  return 4 - (uint)(uVar5 < cinfo->total_iMCU_rows);
}

Assistant:

METHODDEF(int)
decompress_data (j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num;
  int ci, block_row, block_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number < cinfo->output_scan_number ||
	 (cinfo->input_scan_number == cinfo->output_scan_number &&
	  cinfo->input_iMCU_row <= cinfo->output_iMCU_row)) {
    if ((*cinfo->inputctl->consume_input)(cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (! compptr->component_needed)
      continue;
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[ci],
       cinfo->output_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, FALSE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row];
      output_col = 0;
      for (block_num = 0; block_num < compptr->width_in_blocks; block_num++) {
	(*inverse_DCT) (cinfo, compptr, (JCOEFPTR) buffer_ptr,
			output_ptr, output_col);
	buffer_ptr++;
	output_col += compptr->DCT_h_scaled_size;
      }
      output_ptr += compptr->DCT_v_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}